

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalizeSecondAndAppend
          (Normalizer2WithImpl *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  char16_t *pcVar3;
  int iVar4;
  int32_t iVar5;
  ReorderingBuffer buffer;
  UnicodeString safeMiddle;
  ReorderingBuffer local_b0;
  UnicodeString local_70;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((undefined1  [56])((undefined1  [56])first->fUnion & (undefined1  [56])0x1) ==
         (undefined1  [56])0x0) &&
       (pcVar3 = UnicodeString::getBuffer(second), first != second && pcVar3 != (char16_t *)0x0)) {
      sVar1 = (first->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (first->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268
      ;
      local_70.fUnion.fStackFields.fLengthAndFlags = 2;
      local_b0.impl = this->impl;
      local_b0.start = (UChar *)0x0;
      local_b0.reorderStart._0_5_ = 0;
      local_b0.reorderStart._5_3_ = 0;
      local_b0.limit._0_5_ = 0;
      local_b0._37_8_ = 0;
      sVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (second->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      local_b0.str = first;
      iVar2 = ReorderingBuffer::init(&local_b0,(EVP_PKEY_CTX *)(ulong)(uint)(iVar5 + iVar4));
      if ((char)iVar2 != '\0') {
        sVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar2 = (second->fUnion).fFields.fLength;
        }
        else {
          iVar2 = (int)sVar1 >> 5;
        }
        (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x13])
                  (this,pcVar3,pcVar3 + iVar2,(ulong)(uint)(int)doNormalize,&local_70,&local_b0,
                   errorCode);
      }
      ReorderingBuffer::~ReorderingBuffer(&local_b0);
      if (U_ZERO_ERROR < *errorCode) {
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::replace(first,iVar4 - local_70.fUnion.fFields.fLength,0x7fffffff,&local_70);
      }
      UnicodeString::~UnicodeString(&local_70);
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return first;
}

Assistant:

UnicodeString &
    normalizeSecondAndAppend(UnicodeString &first,
                             const UnicodeString &second,
                             UBool doNormalize,
                             UErrorCode &errorCode) const {
        uprv_checkCanGetBuffer(first, errorCode);
        if(U_FAILURE(errorCode)) {
            return first;
        }
        const UChar *secondArray=second.getBuffer();
        if(&first==&second || secondArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return first;
        }
        int32_t firstLength=first.length();
        UnicodeString safeMiddle;
        {
            ReorderingBuffer buffer(impl, first);
            if(buffer.init(firstLength+second.length(), errorCode)) {
                normalizeAndAppend(secondArray, secondArray+second.length(), doNormalize,
                                   safeMiddle, buffer, errorCode);
            }
        }  // The ReorderingBuffer destructor finalizes the first string.
        if(U_FAILURE(errorCode)) {
            // Restore the modified suffix of the first string.
            first.replace(firstLength-safeMiddle.length(), 0x7fffffff, safeMiddle);
        }
        return first;
    }